

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O2

string * __thiscall
OpenMD::DumpWriter::prepareSiteLine_abi_cxx11_
          (string *__return_storage_ptr__,DumpWriter *this,StuntDouble *sd,int ioIndex,int siteIndex
          )

{
  ulong uVar1;
  uint uVar2;
  SnapshotManager *pSVar3;
  undefined4 in_register_0000000c;
  uint uVar4;
  undefined4 in_register_00000084;
  string id;
  Vector3d eField;
  string line;
  string type;
  char tempBuffer [4096];
  allocator<char> local_10c1;
  ulong local_10c0;
  undefined1 *local_10b8;
  undefined8 local_10b0;
  undefined1 local_10a8 [16];
  Vector3d local_1098;
  undefined1 *local_1078;
  undefined8 local_1070;
  undefined1 local_1068 [16];
  undefined1 *local_1058;
  undefined8 local_1050;
  undefined1 local_1048 [16];
  char local_1038 [4104];
  
  pSVar3 = this->info_->sman_;
  uVar4 = pSVar3->atomStorageLayout_;
  uVar2 = pSVar3->rigidBodyStorageLayout_;
  local_10b8 = local_10a8;
  local_10b0 = 0;
  local_10a8[0] = 0;
  local_1058 = local_1048;
  local_1050 = 0;
  local_1078 = local_1068;
  local_1070 = 0;
  local_1048[0] = 0;
  local_1068[0] = 0;
  if (sd->objType_ == otRigidBody) {
    snprintf(local_1038,0x1000,"%10d           ",CONCAT44(in_register_0000000c,ioIndex),
             CONCAT44(in_register_00000084,siteIndex));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1098,local_1038,&local_10c1)
    ;
    std::__cxx11::string::operator=((string *)&local_10b8,(string *)&local_1098);
    std::__cxx11::string::~string((string *)&local_1098);
    uVar4 = uVar2;
  }
  else {
    snprintf(local_1038,0x1000,"%10d %10d",CONCAT44(in_register_0000000c,ioIndex),
             CONCAT44(in_register_00000084,siteIndex));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1098,local_1038,&local_10c1)
    ;
    std::__cxx11::string::operator=((string *)&local_10b8,(string *)&local_1098);
    std::__cxx11::string::~string((string *)&local_1098);
  }
  if (this->needFlucQ_ == true) {
    if ((uVar4 >> 0xe & 1) != 0) {
      std::__cxx11::string::append((char *)&local_1058);
      uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).flucQPos.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + sd->storage_) +
                        (long)sd->localIndex_ * 8);
      if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
        local_10c0 = uVar1;
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the fluctuating charge for object %s"
                 ,local_10b8);
        painCave.isFatal = 1;
        simError();
        uVar1 = local_10c0;
      }
      snprintf(local_1038,0x1000," %13e ",uVar1);
      std::__cxx11::string::append((char *)&local_1078);
    }
    if ((short)uVar4 < 0) {
      std::__cxx11::string::append((char *)&local_1058);
      uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).flucQVel.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + sd->storage_) +
                        (long)sd->localIndex_ * 8);
      if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
        local_10c0 = uVar1;
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the fluctuating charge velocity for object %s"
                 ,local_10b8);
        painCave.isFatal = 1;
        simError();
        uVar1 = local_10c0;
      }
      snprintf(local_1038,0x1000," %13e ",uVar1);
      std::__cxx11::string::append((char *)&local_1078);
    }
    if (((uVar4 >> 0x10 & 1) != 0) && (this->needForceVector_ != false)) {
      std::__cxx11::string::append((char *)&local_1058);
      uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).flucQFrc.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start + sd->storage_) +
                        (long)sd->localIndex_ * 8);
      if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
        local_10c0 = uVar1;
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the fluctuating charge force for object %s"
                 ,local_10b8);
        painCave.isFatal = 1;
        simError();
        uVar1 = local_10c0;
      }
      snprintf(local_1038,0x1000," %13e ",uVar1);
      std::__cxx11::string::append((char *)&local_1078);
    }
  }
  if (((uVar4 >> 0xc & 1) != 0) && (this->needElectricField_ != false)) {
    std::__cxx11::string::append((char *)&local_1058);
    StuntDouble::getElectricField(&local_1098,sd);
    if ((0x7fefffffffffffff < (ulong)ABS(local_1098.super_Vector<double,_3U>.data_[0])) ||
       ((0x7fefffffffffffff < (ulong)ABS(local_1098.super_Vector<double,_3U>.data_[1]) ||
        (0x7fefffffffffffff < (ulong)ABS(local_1098.super_Vector<double,_3U>.data_[2]))))) {
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the electric field for object %s",
               local_10b8);
      painCave.isFatal = 1;
      simError();
    }
    snprintf(local_1038,0x1000," %13e %13e %13e",local_1098.super_Vector<double,_3U>.data_[0],
             local_1098.super_Vector<double,_3U>.data_[1],
             local_1098.super_Vector<double,_3U>.data_[2]);
    std::__cxx11::string::append((char *)&local_1078);
  }
  if (((uVar4 >> 0x11 & 1) != 0) && (this->needSitePotential_ != false)) {
    std::__cxx11::string::append((char *)&local_1058);
    uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).sitePotential
                                        .super__Vector_base<double,_std::allocator<double>_>._M_impl
                                        .super__Vector_impl_data._M_start + sd->storage_) +
                      (long)sd->localIndex_ * 8);
    if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
      local_10c0 = uVar1;
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the site potential for object %s",
               local_10b8);
      painCave.isFatal = 1;
      simError();
      uVar1 = local_10c0;
    }
    snprintf(local_1038,0x1000," %13e ",uVar1);
    std::__cxx11::string::append((char *)&local_1078);
  }
  if (((uVar4 & 0x40) != 0) && (this->needParticlePot_ != false)) {
    std::__cxx11::string::append((char *)&local_1058);
    uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).particlePot.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + sd->storage_) +
                      (long)sd->localIndex_ * 8);
    if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
      local_10c0 = uVar1;
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the particle  potential for object %s"
               ,local_10b8);
      painCave.isFatal = 1;
      simError();
      uVar1 = local_10c0;
    }
    snprintf(local_1038,0x1000," %13e",uVar1);
    std::__cxx11::string::append((char *)&local_1078);
  }
  if (((char)uVar4 < '\0') && (this->needDensity_ != false)) {
    std::__cxx11::string::append((char *)&local_1058);
    uVar1 = *(ulong *)(*(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).density.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + sd->storage_) +
                      (long)sd->localIndex_ * 8);
    if (0x7fefffffffffffff < (uVar1 & 0x7fffffffffffffff)) {
      local_10c0 = uVar1;
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the density  for object %s",local_10b8
              );
      painCave.isFatal = 1;
      simError();
      uVar1 = local_10c0;
    }
    snprintf(local_1038,0x1000," %13e",uVar1);
    std::__cxx11::string::append((char *)&local_1078);
  }
  snprintf(local_1038,0x1000,"%s %7s %s\n",local_10b8,local_1058,local_1078);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_1038,(allocator<char> *)&local_1098);
  std::__cxx11::string::~string((string *)&local_1078);
  std::__cxx11::string::~string((string *)&local_1058);
  std::__cxx11::string::~string((string *)&local_10b8);
  return __return_storage_ptr__;
}

Assistant:

std::string DumpWriter::prepareSiteLine(StuntDouble* sd, int ioIndex,
                                          int siteIndex) {
    int asl  = info_->getSnapshotManager()->getAtomStorageLayout();
    int rbsl = info_->getSnapshotManager()->getRigidBodyStorageLayout();
    int sl {};

    std::string id;
    std::string type;
    std::string line;
    char tempBuffer[4096];

    if (sd->isRigidBody()) {
      sl = rbsl;
      snprintf(tempBuffer, 4096, "%10d           ", ioIndex);
      id = std::string(tempBuffer);
    } else {
      sl = asl;
      snprintf(tempBuffer, 4096, "%10d %10d", ioIndex, siteIndex);
      id = std::string(tempBuffer);
    }

    if (needFlucQ_) {
      if (sl & DataStorage::dslFlucQPosition) {
        type += "c";
        RealType fqPos = sd->getFlucQPos();
        if (std::isinf(fqPos) || std::isnan(fqPos)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the"
                   " fluctuating charge for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e ", fqPos);
        line += tempBuffer;
      }

      if (sl & DataStorage::dslFlucQVelocity) {
        type += "w";
        RealType fqVel = sd->getFlucQVel();
        if (std::isinf(fqVel) || std::isnan(fqVel)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the"
                   " fluctuating charge velocity for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e ", fqVel);
        line += tempBuffer;
      }

      if (needForceVector_) {
        if (sl & DataStorage::dslFlucQForce) {
          type += "g";
          RealType fqFrc = sd->getFlucQFrc();
          if (std::isinf(fqFrc) || std::isnan(fqFrc)) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "DumpWriter detected a numerical error writing the"
                     " fluctuating charge force for object %s",
                     id.c_str());
            painCave.isFatal = 1;
            simError();
          }
          snprintf(tempBuffer, 4096, " %13e ", fqFrc);
          line += tempBuffer;
        }
      }
    }

    if (needElectricField_) {
      if (sl & DataStorage::dslElectricField) {
        type += "e";
        Vector3d eField = sd->getElectricField();
        if (std::isinf(eField[0]) || std::isnan(eField[0]) ||
            std::isinf(eField[1]) || std::isnan(eField[1]) ||
            std::isinf(eField[2]) || std::isnan(eField[2])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the electric"
                   " field for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e %13e %13e", eField[0], eField[1],
                 eField[2]);
        line += tempBuffer;
      }
    }

    if (needSitePotential_) {
      if (sl & DataStorage::dslSitePotential) {
        type += "s";
        RealType sPot = sd->getSitePotential();
        if (std::isinf(sPot) || std::isnan(sPot)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the"
                   " site potential for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e ", sPot);
        line += tempBuffer;
      }
    }

    if (needParticlePot_) {
      if (sl & DataStorage::dslParticlePot) {
        type += "u";
        RealType particlePot = sd->getParticlePot();
        if (std::isinf(particlePot) || std::isnan(particlePot)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the particle "
                   " potential for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e", particlePot);
        line += tempBuffer;
      }
    }

    if (needDensity_) {
      if (sl & DataStorage::dslDensity) {
        type += "d";
        RealType density = sd->getDensity();
        if (std::isinf(density) || std::isnan(density)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the density "
                   " for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e", density);
        line += tempBuffer;
      }
    }

    snprintf(tempBuffer, 4096, "%s %7s %s\n", id.c_str(), type.c_str(),
             line.c_str());
    return std::string(tempBuffer);
  }